

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EdExplFinder.cpp
# Opt level: O2

void __thiscall EdExplFinder::bfs_shortest_path(EdExplFinder *this)

{
  int iVar1;
  _Elt_pointer ppVar2;
  pointer piVar3;
  bool bVar4;
  int iVar5;
  _Vector_base<int,_std::allocator<int>_> *this_00;
  _Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_01;
  size_type sVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int k;
  int iVar10;
  int iVar11;
  int iVar12;
  int c2;
  int c;
  int iVar13;
  long lVar14;
  reference rVar15;
  pair<int,_int> node;
  pair<int,_int> currentNode;
  int local_78;
  pair<int,_int> start_node;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  node_set;
  
  this_00 = (_Vector_base<int,_std::allocator<int>_> *)operator_new(0x18);
  iVar11 = this->seqSize + 1;
  node_set._M_t._M_impl._0_4_ = this->lb + 1;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)this_00,(ulong)(uint)(iVar11 * iVar11),
             (value_type_conflict1 *)&node_set,(allocator_type *)&start_node);
  (this_00->_M_impl).super__Vector_impl_data._M_start[(this->seqSize + 2) * this->seqSize] = 0;
  this_01 = (_Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
            operator_new(0x50);
  std::queue<std::pair<int,int>,std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>>::
  queue<std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>,void>
            ((queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              *)this_01);
  node_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &node_set._M_t._M_impl.super__Rb_tree_header._M_header;
  node_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  node_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  node_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  start_node.first = this->seqSize;
  start_node.second = start_node.first;
  node_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       node_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
            ((deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this_01,
             &start_node);
  std::
  _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
  ::_M_insert_unique<std::pair<int,int>const&>
            ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
              *)&node_set,&start_node);
  local_78 = this->lb / this->min_id_cost;
  do {
    do {
      do {
        ppVar2 = (this_01->_M_impl).super__Deque_impl_data._M_start._M_cur;
        if ((this_01->_M_impl).super__Deque_impl_data._M_finish._M_cur == ppVar2) {
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(this_00);
          operator_delete(this_00);
          std::_Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Deque_base
                    (this_01);
          operator_delete(this_01);
          std::
          _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
          ::~_Rb_tree(&node_set._M_t);
          return;
        }
        currentNode = *ppVar2;
        std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::pop_front
                  ((deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this_01);
        std::
        _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
        ::erase(&node_set._M_t,&currentNode);
        iVar5 = currentNode.first;
        uVar9 = (ulong)currentNode & 0xffffffff;
        iVar13 = currentNode.second;
        iVar11 = (this_00->_M_impl).super__Vector_impl_data._M_start
                 [(this->seqSize + 1) * currentNode.first + currentNode.second];
      } while (this->lb <= iVar11);
      iVar1 = currentNode.second + -1;
      iVar7 = iVar1;
      if (currentNode.first - local_78 < currentNode.second && 0 < currentNode.second) {
        do {
          if (this->seqSize <= iVar7) {
            lVar14 = 0;
            goto LAB_00159191;
          }
          rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (this->seq2ExcludedCharacters,(long)iVar7 * ((long)this->max_char + 1))
          ;
          iVar7 = iVar7 + 1;
        } while ((*rVar15._M_p & rVar15._M_mask) == 0);
        lVar14 = 1;
LAB_00159191:
        for (; lVar14 <= this->max_char; lVar14 = lVar14 + 1) {
          if (lVar14 == 0) {
            iVar7 = 0;
          }
          else {
            iVar7 = this->insertion_cost->data[(int)lVar14 - 1];
          }
          uVar8 = (this->seqSize + 1) * iVar5 + iVar1;
          iVar7 = iVar7 + iVar11;
          if (this->dpMatrix->data[uVar8] + iVar7 < this->lb) {
            rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (this->seq2ExcludedCharacters,
                                (long)((this->max_char + 1) * iVar1 + (int)lVar14));
            *rVar15._M_p = *rVar15._M_p | rVar15._M_mask;
          }
          else {
            piVar3 = (this_00->_M_impl).super__Vector_impl_data._M_start;
            iVar10 = piVar3[(int)uVar8];
            if (iVar7 < iVar10) {
              iVar10 = iVar7;
            }
            piVar3[(int)uVar8] = iVar10;
            node.first = iVar5;
            node.second = iVar1;
            sVar6 = std::
                    set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                    ::count(&node_set,&node);
            if (sVar6 == 0) {
              std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                        ((deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         this_01,&node);
              std::
              _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
              ::_M_insert_unique<std::pair<int,int>const&>
                        ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                          *)&node_set,&node);
            }
          }
        }
      }
    } while (iVar5 < 1);
    iVar10 = iVar5 + -1;
    iVar7 = iVar10;
    if (iVar13 < local_78 + iVar5) {
      do {
        if (this->seqSize <= iVar7) {
          lVar14 = 0;
          goto LAB_0015934a;
        }
        rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (this->seq1ExcludedCharacters,(long)iVar7 * ((long)this->max_char + 1));
        iVar7 = iVar7 + 1;
      } while ((*rVar15._M_p & rVar15._M_mask) == 0);
      lVar14 = 1;
LAB_0015934a:
      for (; lVar14 <= this->max_char; lVar14 = lVar14 + 1) {
        if (lVar14 == 0) {
          iVar5 = 0;
        }
        else {
          iVar5 = this->deletion_cost->data[(int)lVar14 - 1];
        }
        uVar8 = (this->seqSize + 1) * iVar10 + iVar13;
        iVar5 = iVar5 + iVar11;
        if (this->dpMatrix->data[uVar8] + iVar5 < this->lb) {
          rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (this->seq1ExcludedCharacters,
                              (long)((this->max_char + 1) * iVar10 + (int)lVar14));
          *rVar15._M_p = *rVar15._M_p | rVar15._M_mask;
        }
        else {
          piVar3 = (this_00->_M_impl).super__Vector_impl_data._M_start;
          iVar7 = piVar3[(int)uVar8];
          if (iVar5 < iVar7) {
            iVar7 = iVar5;
          }
          piVar3[(int)uVar8] = iVar7;
          node.second = iVar13;
          node.first = iVar10;
          sVar6 = std::
                  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                  ::count(&node_set,&node);
          if (sVar6 == 0) {
            std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                      ((deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this_01,
                       &node);
            std::
            _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
            ::_M_insert_unique<std::pair<int,int>const&>
                      ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                        *)&node_set,&node);
          }
        }
      }
    }
    if (0 < iVar13) {
      iVar5 = this->max_char;
      iVar13 = 0;
      for (lVar14 = 1; lVar14 <= iVar5; lVar14 = lVar14 + 1) {
        for (iVar7 = 1; iVar7 <= iVar5; iVar7 = iVar7 + 1) {
          uVar8 = (this->seqSize + 1) * iVar10 + iVar1;
          iVar5 = this->substitution_cost->data[(iVar5 * iVar13 + iVar7) - 1] + iVar11;
          if (this->dpMatrix->data[uVar8] + iVar5 < this->lb) {
            bVar4 = IntView<0>::indomain(this->seq1 + (uVar9 - 1),lVar14);
            iVar5 = this->max_char + 1;
            if (bVar4) {
              rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (this->seq2ExcludedCharacters,(long)(iVar5 * iVar1 + iVar7));
            }
            else {
              rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (this->seq1ExcludedCharacters,(long)(iVar5 * iVar10 + (int)lVar14))
              ;
            }
            *rVar15._M_p = *rVar15._M_p | rVar15._M_mask;
          }
          else {
            piVar3 = (this_00->_M_impl).super__Vector_impl_data._M_start;
            iVar12 = piVar3[(int)uVar8];
            if (iVar5 < iVar12) {
              iVar12 = iVar5;
            }
            piVar3[(int)uVar8] = iVar12;
            node.first = iVar10;
            node.second = iVar1;
            sVar6 = std::
                    set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                    ::count(&node_set,&node);
            if (sVar6 == 0) {
              std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                        ((deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         this_01,&node);
              std::
              _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
              ::_M_insert_unique<std::pair<int,int>const&>
                        ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                          *)&node_set,&node);
            }
          }
          iVar5 = this->max_char;
        }
        iVar13 = iVar13 + 1;
      }
    }
  } while( true );
}

Assistant:

void EdExplFinder::bfs_shortest_path() {
	auto* shortestPathMatrix =
			new std::vector<int>(static_cast<size_t>((seqSize + 1) * (seqSize + 1)), lb + 1);
	// set shortest path for bottom right position to 0 cost
	(*shortestPathMatrix)[matrixCoord(seqSize, seqSize)] = 0;

	auto* nodeQueue = new std::queue<std::pair<int, int> >();
	std::set<std::pair<int, int> > node_set;
	// start with bottom right position
	const std::pair<int, int> start_node = std::pair<int, int>(seqSize, seqSize);
	nodeQueue->push(start_node);
	node_set.insert(start_node);

	// d = distance to diagonal that should be calculated in the matrix
	const int d = lb / min_id_cost;

	while (!nodeQueue->empty()) {
		const std::pair<int, int> currentNode = nodeQueue->front();
		nodeQueue->pop();
		node_set.erase(currentNode);

		const int i = currentNode.first;
		const int j = currentNode.second;

		const int s_ij = (*shortestPathMatrix)[matrixCoord(i, j)];

		if (s_ij >= lb) {
			continue;
		}

		//
		// process move to the left
		//
		if (j - 1 >= 0 && j - 1 >= i - d) {
			// check if 0 is forbidden in any sequence position that is larger or equal than the current
			// position
			int cj_start = 0;
			for (int k = j - 1; k < seqSize; k++) {
				if ((*seq2ExcludedCharacters)[excludedCharCoord(k, 0)]) {
					// if 0 is forbidden, we do not need to include it in the explanation
					cj_start = 1;
					break;
				}
			}
			for (int c = cj_start; c <= max_char; c++) {
				const int ins_cost = c == 0 ? 0 : (*insertion_cost)[c - 1];
				const int d_ij_minus_1 = (*dpMatrix)[matrixCoord(i, j - 1)];
				if (d_ij_minus_1 + ins_cost + s_ij < lb) {
					// exclude character for position in explanation if a cheaper path could be established
					(*seq2ExcludedCharacters)[excludedCharCoord(j - 1, c)] = true;
				} else {
					// update costs and push node to queue
					const int s_ij_minus_1 = (*shortestPathMatrix)[matrixCoord(i, j - 1)];
					(*shortestPathMatrix)[matrixCoord(i, j - 1)] = std::min(s_ij_minus_1, s_ij + ins_cost);

					const std::pair<int, int> node = std::pair<int, int>(i, j - 1);
					if (node_set.count(node) == 0) {
						nodeQueue->push(node);
						node_set.insert(node);
					}
				}
			}
		}

		//
		// process upwards move
		//
		if (i - 1 >= 0 && j < i + d) {
			int ci_start = 0;
			// check if 0 is forbidden in any sequence position that is larger or equal than the current
			// position
			for (int k = i - 1; k < seqSize; k++) {
				if ((*seq1ExcludedCharacters)[excludedCharCoord(k, 0)]) {
					// if 0 is forbidden, we do not need to include it in the explanation
					ci_start = 1;
					break;
				}
			}
			for (int c = ci_start; c <= max_char; c++) {
				const int del_cost = c == 0 ? 0 : (*deletion_cost)[c - 1];
				const int d_i_minus_1_j = (*dpMatrix)[matrixCoord(i - 1, j)];
				if (d_i_minus_1_j + del_cost + s_ij < lb) {
					// exclude character for position in explanation if a cheaper path could be established
					(*seq1ExcludedCharacters)[excludedCharCoord(i - 1, c)] = true;
				} else {
					// update costs and push node to queue
					const int s_i_minus_1_j = (*shortestPathMatrix)[matrixCoord(i - 1, j)];
					(*shortestPathMatrix)[matrixCoord(i - 1, j)] = std::min(s_i_minus_1_j, s_ij + del_cost);

					const std::pair<int, int> node = std::pair<int, int>(i - 1, j);
					if (node_set.count(node) == 0) {
						nodeQueue->push(node);
						node_set.insert(node);
					}
				}
			}
		}

		//
		// process diagonal move
		//
		if (i - 1 >= 0 && j - 1 >= 0) {
			for (int c1 = 1; c1 <= max_char; c1++) {
				for (int c2 = 1; c2 <= max_char; c2++) {
					const int d_i_minus_1_j_minus_1 = (*dpMatrix)[matrixCoord(i - 1, j - 1)];
					const int subst_cost = (*substitution_cost)[substCoord(c1, c2)];

					if (d_i_minus_1_j_minus_1 + subst_cost + s_ij < lb) {
						// we can either exclude the character for seq1 or seq2
						if (seq1[i - 1].indomain(c1)) {
							// if seq1 contains c1, we exclude c2 from seq2
							(*seq2ExcludedCharacters)[excludedCharCoord(j - 1, c2)] = true;
						} else {
							// if seq2 contains c2, or neither seq1/seq2 contain c1/c2 we exclude c1 from seq1
							(*seq1ExcludedCharacters)[excludedCharCoord(i - 1, c1)] = true;
						}
					} else {
						const int s_i_minus_1_j_minus_1 = (*shortestPathMatrix)[matrixCoord(i - 1, j - 1)];
						(*shortestPathMatrix)[matrixCoord(i - 1, j - 1)] =
								std::min(s_i_minus_1_j_minus_1, s_ij + subst_cost);

						const std::pair<int, int> node = std::pair<int, int>(i - 1, j - 1);
						if (node_set.count(node) == 0) {
							nodeQueue->push(node);
							node_set.insert(node);
						}
					}
				}
			}
		}
	}

#ifndef NDEBUG
	debug_print(shortestPathMatrix);
#endif

	delete shortestPathMatrix;
	delete nodeQueue;
}